

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestVarious.hpp
# Opt level: O2

void __thiscall Omega_index_list_Test::TestBody(Omega_index_list_Test *this)

{
  char *message;
  AssertHelper local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  AssertionResult gtest_ar;
  __type t1;
  
  t1.super__Tuple_impl<0UL,_const_char_*,_int,_int,_double>.super__Tuple_impl<1UL,_int,_int,_double>
  .super__Tuple_impl<2UL,_int,_double>.super__Tuple_impl<3UL,_double>.
  super__Head_base<3UL,_double,_false>._M_head_impl = (_Head_base<3UL,_double,_false>)10.5;
  t1.super__Tuple_impl<0UL,_const_char_*,_int,_int,_double>.super__Tuple_impl<1UL,_int,_int,_double>
  .super__Tuple_impl<2UL,_int,_double>.super__Head_base<2UL,_int,_false>._M_head_impl = 6;
  t1.super__Tuple_impl<0UL,_const_char_*,_int,_int,_double>.super__Tuple_impl<1UL,_int,_int,_double>
  .super__Tuple_impl<2UL,_int,_double>._12_4_ = 7;
  t1.super__Tuple_impl<0UL,_const_char_*,_int,_int,_double>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl = "yuppi!";
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"std::get<3>(t1)","std::get<6>(t)",(double *)&t1,(double *)&::t);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/meox[P]omega/Test/TestVarious.hpp"
               ,0x30,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_38);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(Omega, index_list)
{
    auto const t1 = omega::make_index_list<3, 2, 1, 6>(t); // decltype(t3) = std::tuple<const char*, int, int, double>

    EXPECT_EQ (std::get<3>(t1), std::get<6>(t));
}